

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oprom_parser.c
# Opt level: O0

int image_oprom_get_device(igsc_oprom_image *img,uint32_t num,oprom_subsystem_device_id *device)

{
  long lVar1;
  uint32_t uVar2;
  uint uVar3;
  igsc_log_func_t p_Var4;
  char *pcVar5;
  long in_FS_OFFSET;
  igsc_log_func_t igsc_log_func;
  uint32_t max_num;
  oprom_subsystem_device_id *device_local;
  uint32_t num_local;
  igsc_oprom_image *img_local;
  char local_98 [8];
  char __time_buf [128];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = image_oprom_count_devices(img);
  uVar3 = igsc_get_log_level();
  if (uVar3 != 0) {
    p_Var4 = igsc_get_log_callback_func();
    if (p_Var4 == (igsc_log_func_t)0x0) {
      pcVar5 = gsc_time(local_98,0x80);
      syslog(7,"%s: IGSC: (%s:%s():%d) max_num %u num %u\n",pcVar5,
             "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/oprom_parser.c",
             "image_oprom_get_device",0x319,uVar2,num);
    }
    else {
      p_Var4 = igsc_get_log_callback_func();
      pcVar5 = gsc_time(local_98,0x80);
      (*p_Var4)(IGSC_LOG_LEVEL_DEBUG,"%s: IGSC: (%s:%s():%d) max_num %u num %u\n",pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/intel[P]igsc/lib/oprom_parser.c",
                "image_oprom_get_device",0x319,uVar2,num);
    }
  }
  if (num < uVar2) {
    gsc_memcpy_s(device,4,&(img->cpd_img).dev_ext[1].extension_type + num,4);
    img_local._4_4_ = 0;
  }
  else {
    img_local._4_4_ = 4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return img_local._4_4_;
}

Assistant:

int image_oprom_get_device(struct igsc_oprom_image *img, uint32_t num,
                           struct oprom_subsystem_device_id *device)
{
    uint32_t max_num = image_oprom_count_devices(img);

    gsc_debug("max_num %u num %u\n", max_num, num);
    if (num < max_num)
    {
        gsc_memcpy_s(device, sizeof(*device),
                     &img->cpd_img.dev_ext->device_ids[num],
                     sizeof(*device));
        return IGSC_SUCCESS;
    }

    return IGSC_ERROR_DEVICE_NOT_FOUND;
}